

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

void testing::internal::PrintTestPartResult(TestPartResult *test_part_result)

{
  undefined8 uVar1;
  TestPartResult *in_RDX;
  string local_38;
  string *local_18;
  string *result;
  TestPartResult *test_part_result_local;
  
  result = (string *)test_part_result;
  PrintTestPartResultToString_abi_cxx11_(&local_38,(internal *)test_part_result,in_RDX);
  local_18 = &local_38;
  uVar1 = std::__cxx11::string::c_str();
  printf("%s\n",uVar1);
  fflush(_stdout);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void PrintTestPartResult(const TestPartResult& test_part_result) {
  const std::string& result =
      PrintTestPartResultToString(test_part_result);
  printf("%s\n", result.c_str());
  fflush(stdout);
  // If the test program runs in Visual Studio or a debugger, the
  // following statements add the test part result message to the Output
  // window such that the user can double-click on it to jump to the
  // corresponding source code location; otherwise they do nothing.
#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MOBILE
  // We don't call OutputDebugString*() on Windows Mobile, as printing
  // to stdout is done by OutputDebugString() there already - we don't
  // want the same message printed twice.
  ::OutputDebugStringA(result.c_str());
  ::OutputDebugStringA("\n");
#endif
}